

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_type_createAnonymousClassAndMetaclass(sysbvm_context_t *context,sysbvm_tuple_t supertype)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t *psVar2;
  _Bool _Var3;
  int iVar4;
  size_t typeTag;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  sysbvm_tuple_t *psVar7;
  size_t immediateTypeTag;
  
  sVar5 = (context->roots).classType;
  if (supertype == 0) {
    supertype = (context->roots).objectType;
  }
  _Var3 = sysbvm_tuple_isKindOf(context,supertype,sVar5);
  if (_Var3) {
    immediateTypeTag = supertype & 0xf;
    if (immediateTypeTag == 0 && (sysbvm_tuple_t *)supertype != (sysbvm_tuple_t *)0x0) {
      sVar5 = *(sysbvm_tuple_t *)supertype;
    }
    else {
      iVar4 = (int)immediateTypeTag;
      psVar2 = (sysbvm_tuple_t *)supertype;
joined_r0x001452a7:
      if (iVar4 == 0xf) {
        sVar5 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar2 >> 4);
      }
      else {
        sVar5 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
      }
    }
  }
  else {
    psVar2 = (sysbvm_tuple_t *)(context->roots).typeType;
    if (((((ulong)psVar2 & 0xf) == 0 && psVar2 != (sysbvm_tuple_t *)0x0) &&
        ((supertype & 0xf) == 0 && (sysbvm_tuple_t *)supertype != (sysbvm_tuple_t *)0x0)) &&
       (psVar7 = (sysbvm_tuple_t *)supertype, (*(sysbvm_tuple_t *)(supertype + 8) & 0x80) == 0)) {
      do {
        if (psVar7 == psVar2) {
          psVar2 = *(sysbvm_tuple_t **)(supertype + 0x30);
          immediateTypeTag = (ulong)psVar2 & 0xf;
          if (immediateTypeTag != 0 || psVar2 == (sysbvm_tuple_t *)0x0) {
            iVar4 = (int)immediateTypeTag;
            goto joined_r0x001452a7;
          }
          sVar5 = *psVar2;
          break;
        }
        psVar1 = psVar7 + 6;
        psVar7 = (sysbvm_tuple_t *)*psVar1;
      } while ((sysbvm_tuple_t *)*psVar1 != (sysbvm_tuple_t *)0x0);
    }
  }
  sVar5 = sysbvm_type_createAnonymousMetaclass(context,sVar5);
  sVar6 = sysbvm_type_createAnonymousClass(context,supertype,sVar5);
  *(sysbvm_tuple_t *)(sVar5 + 0xf8) = sVar6;
  return sVar6;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousClassAndMetaclass(sysbvm_context_t *context, sysbvm_tuple_t supertype)
{
    sysbvm_tuple_t metaclassSupertype = context->roots.classType;
    sysbvm_tuple_t actualSuperType = supertype;
    if(!supertype)
        actualSuperType = context->roots.objectType;

    if(sysbvm_tuple_isKindOf(context, actualSuperType, context->roots.classType))
        metaclassSupertype = sysbvm_tuple_getType(context, actualSuperType);
    else if(sysbvm_type_isDirectSubtypeOf(actualSuperType, context->roots.typeType))
        metaclassSupertype = sysbvm_tuple_getType(context, sysbvm_type_getSupertype(actualSuperType));

    sysbvm_tuple_t metaclass = sysbvm_type_createAnonymousMetaclass(context, metaclassSupertype);
    sysbvm_tuple_t class = sysbvm_type_createAnonymousClass(context, actualSuperType, metaclass);

    // Link together the class with its metaclass.
    sysbvm_metaclass_t *metaclassObject = (sysbvm_metaclass_t*)metaclass;
    metaclassObject->super.thisType = class;
    return class;
}